

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShadersIsolines::TessellationShadersIsolines
          (TessellationShadersIsolines *this,Context *context,ExtParameters *extParams)

{
  _Rb_tree_header *p_Var1;
  
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,"isolines_tessellation",
             "Verifies that the number of isolines generated during tessellation is derived from the first outer tessellation level.\nMakes sure that the number of segments in each isoline is derived from the second outer tessellation level.\nMakes sure that both inner tessellation levels and the 3rd and the 4th outer tessellation levels do not affect the tessellation process.\nMakes sure that equal_spacing vertex spacing mode does not affect amount of generated isolines.\nMakes sure no line is drawn between (0, 1) and (1, 1) in (u, v) domain."
            );
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShadersIsolines_02113070;
  this->m_irrelevant_tess_value_1 = 0.0;
  this->m_irrelevant_tess_value_2 = 0.0;
  p_Var1 = &(this->m_test_results)._M_t._M_impl.super__Rb_tree_header;
  (this->m_test_results)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_test_results)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_test_results)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_test_results)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_test_results)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_utils_ptr = (TessellationShaderUtils *)0x0;
  this->m_vao_id = 0;
  return;
}

Assistant:

TessellationShadersIsolines::TessellationShadersIsolines(Context& context, const ExtParameters& extParams)
	: TestCaseBase(context, extParams, "isolines_tessellation",
				   "Verifies that the number of isolines generated during tessellation is "
				   "derived from the first outer tessellation level.\n"
				   "Makes sure that the number of segments in each isoline is derived from "
				   "the second outer tessellation level.\n"
				   "Makes sure that both inner tessellation levels and the 3rd and the 4th "
				   "outer tessellation levels do not affect the tessellation process.\n"
				   "Makes sure that equal_spacing vertex spacing mode does not affect amount"
				   " of generated isolines.\n"
				   "Makes sure no line is drawn between (0, 1) and (1, 1) in (u, v) domain.")
	, m_irrelevant_tess_value_1(0.0f)
	, m_irrelevant_tess_value_2(0.0f)
	, m_utils_ptr(DE_NULL)
	, m_vao_id(0)
{
	/* Left blank on purpose */
}